

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDEdge::RemoveFaceFromArray(ON_SubDEdge *this,uint i,ON_SubDFacePtr *removed_face)

{
  uint uVar1;
  uint local_30;
  uint j;
  uint count;
  ON_SubDFacePtr *removed_face_local;
  uint i_local;
  ON_SubDEdge *this_local;
  
  removed_face->m_ptr = (ON__UINT_PTR)(ON_SubDFacePtr)0x0;
  uVar1 = (uint)this->m_face_count;
  if (i < uVar1) {
    if (i < 2) {
      removed_face->m_ptr = this->m_face2[i].m_ptr;
    }
    if (2 < uVar1) {
      if ((this->m_facex == (ON_SubDFacePtr *)0x0) ||
         (this->m_facex_capacity + 2 < (uint)this->m_face_count)) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      if (1 < i) {
        removed_face->m_ptr = this->m_facex[i - 2].m_ptr;
      }
    }
    local_30 = i + 1;
    removed_face_local._4_4_ = i;
    while (local_30 < 2 && local_30 < uVar1) {
      this->m_face2[removed_face_local._4_4_].m_ptr = this->m_face2[local_30].m_ptr;
      local_30 = local_30 + 1;
      removed_face_local._4_4_ = removed_face_local._4_4_ + 1;
    }
    if (2 < uVar1) {
      this->m_face2[1].m_ptr = this->m_facex->m_ptr;
      removed_face_local._4_4_ = 0;
      local_30 = 1;
      while (local_30 < uVar1 - 2) {
        this->m_facex[removed_face_local._4_4_].m_ptr = this->m_facex[local_30].m_ptr;
        local_30 = local_30 + 1;
        removed_face_local._4_4_ = removed_face_local._4_4_ + 1;
      }
    }
    this->m_face_count = this->m_face_count - 1;
    this_local._7_1_ = true;
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDEdge::RemoveFaceFromArray(
  unsigned int i,
  ON_SubDFacePtr& removed_face
  )
{
  removed_face = ON_SubDFacePtr::Null;
  unsigned int count = m_face_count;
  if ( i >= count )
    return ON_SUBD_RETURN_ERROR(false);
  if (i < 2)
  {
    removed_face = m_face2[i];
  }
  if (count > 2)
  {
    if ( nullptr == m_facex || m_facex_capacity + ((unsigned short)2) < m_face_count )
      return ON_SUBD_RETURN_ERROR(false);
    if ( i >= 2 )
      removed_face = m_facex[i-2];
  }

  unsigned int j = i+1U;

  while (j < 2 && j < count)
  {
    // NOTE: 
    // 0 <= i < j < min(2,count) <= 2 so any warning that the following line may 
    // result in an invalid write is incorrect.
    m_face2[i++] = m_face2[j++];
  }

  if (count > 2)
  {
    m_face2[1] = m_facex[0];
    i = 0;
    j = 1;
    count -= 2;
    while (j < count )
      m_facex[i++] = m_facex[j++];
  }

  m_face_count--;

  return true;

}